

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitConstantArgsToFltArray
               (ByteCodeGenerator *byteCodeGenerator,double *vars,ParseNode *args,uint argCount)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  ParseNodeInt *pPVar5;
  ParseNodeFloat *pPVar6;
  undefined4 *puVar7;
  uint local_28;
  OpCode nop;
  uint index;
  uint argCount_local;
  ParseNode *args_local;
  double *vars_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  local_28 = 0;
  _index = args;
  do {
    if (_index->nop != knopList || argCount <= local_28) {
      if (argCount <= local_28) {
        Js::Throw::InternalError();
      }
      if (_index->nop == knopInt) {
        pPVar5 = ParseNode::AsParseNodeInt(_index);
        vars[local_28] = (double)pPVar5->lw;
      }
      else {
        if (_index->nop != knopFlt) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1e7d,"(args->nop == knopFlt)","args->nop == knopFlt");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pPVar6 = ParseNode::AsParseNodeFloat(_index);
        vars[local_28] = pPVar6->dbl;
      }
      local_28 = local_28 + 1;
      if (local_28 != argCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e81,"(index == argCount)","index == argCount");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      return;
    }
    pPVar4 = ParseNode::AsParseNodeBin(_index);
    OVar1 = pPVar4->pnode1->nop;
    if (OVar1 == knopInt) {
      pPVar4 = ParseNode::AsParseNodeBin(_index);
      pPVar5 = ParseNode::AsParseNodeInt(pPVar4->pnode1);
      vars[local_28] = (double)pPVar5->lw;
    }
    else {
      if (OVar1 != knopFlt) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e6b,"(nop == knopFlt)","nop == knopFlt");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pPVar4 = ParseNode::AsParseNodeBin(_index);
      pPVar6 = ParseNode::AsParseNodeFloat(pPVar4->pnode1);
      vars[local_28] = pPVar6->dbl;
    }
    local_28 = local_28 + 1;
    pPVar4 = ParseNode::AsParseNodeBin(_index);
    _index = pPVar4->pnode2;
  } while( true );
}

Assistant:

void EmitConstantArgsToFltArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) double *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        OpCode nop = args->AsParseNodeBin()->pnode1->nop;
        if (nop == knopInt)
        {
            vars[index++] = (double)args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        }
        else
        {
            Assert(nop == knopFlt);
            vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeFloat()->dbl;
        }
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    if (args->nop == knopInt)
    {
        vars[index++] = (double)args->AsParseNodeInt()->lw;
    }
    else
    {
        Assert(args->nop == knopFlt);
        vars[index++] = args->AsParseNodeFloat()->dbl;
    }

    Assert(index == argCount);
}